

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPermit::IfcPermit(IfcPermit *this)

{
  IfcPermit *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x110,"IfcPermit");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__01087b30);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>,
             &PTR_construction_vtable_24__01087be0);
  *(undefined8 *)this = 0x1087a50;
  *(undefined8 *)&this->field_0x110 = 0x1087b18;
  *(undefined8 *)&this->field_0x88 = 0x1087a78;
  *(undefined8 *)&this->field_0x98 = 0x1087aa0;
  *(undefined8 *)&this->field_0xd0 = 0x1087ac8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x1087af0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x10);
  return;
}

Assistant:

IfcPermit() : Object("IfcPermit") {}